

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::EnableLanguage
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *languages,bool optional)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppcVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  undefined8 uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *this_01;
  string *language;
  pointer pbVar12;
  pointer pbVar13;
  string_view value;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages_without_RC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages_for_RC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_languages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicate_languages;
  string local_108;
  string local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined4 local_ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *__s;
  
  if (this->DeferRunning == true) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Languages may not be enabled during deferred execution.","");
    ppcVar3 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar3) {
      ppcVar3[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_108,&this->Backtrace
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      return;
    }
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    return;
  }
  iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x15])();
  __s = (char *)CONCAT44(extraout_var,iVar4);
  if (__s != (char *)0x0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_CFG_INTDIR","");
    sVar5 = strlen(__s);
    value._M_str = __s;
    value._M_len = sVar5;
    AddDefinition(this,&local_108,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbVar12 = (languages->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar13 = (languages->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar12 != pbVar13) {
    do {
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pbVar12);
      this_00 = &local_c8;
      if ((_Var6._M_current ==
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (_Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (local_a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,pbVar12),
         this_00 = &local_a8,
         _Var6._M_current ==
         local_a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,pbVar12);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar13);
  }
  local_ac = (undefined4)CONCAT71(in_register_00000011,optional);
  if (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ac31d;
  paVar2 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar2;
  if ((long)local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108," has","");
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"s have","");
  }
  std::operator+(&local_50,
                 "Languages to be enabled may not be specified more than once at the same time. The following language"
                 ,&local_108);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_80 = *puVar9;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar9;
    local_90 = (ulong *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  separator._M_str = ", ";
  separator._M_len = 2;
  cmJoin(&local_70,&local_a8,separator,(string_view)ZEXT816(0));
  uVar10 = 0xf;
  if (local_90 != &local_80) {
    uVar10 = local_80;
  }
  if (uVar10 < local_70._M_string_length + local_88) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar11 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_70._M_string_length + local_88) goto LAB_002ac206;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_002ac206:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_e8.field_2._M_allocated_capacity = *psVar1;
    local_e8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar1;
    local_e8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_e8._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_e8,&this->Backtrace
                     );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_002ac31d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  local_108.field_2._M_allocated_capacity = 0;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8._M_dataplus._M_p = (pointer)0x0;
  local_e8._M_string_length = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108,
            (long)local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar12 = local_c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar13 = local_c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar4 = std::__cxx11::string::compare((char *)pbVar13);
      this_01 = &local_108;
      if (iVar4 == 0) {
        this_01 = &local_e8;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01,pbVar13);
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar12);
  }
  uVar10 = (ulong)(byte)local_ac;
  if (local_108._M_dataplus._M_p != (pointer)local_108._M_string_length) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x11])
              (this->GlobalGenerator,&local_108,this,uVar10);
  }
  if (local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x11])
              (this->GlobalGenerator,&local_e8,this,uVar10);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void cmMakefile::EnableLanguage(std::vector<std::string> const& languages,
                                bool optional)
{
  if (this->DeferRunning) {
    this->IssueMessage(
      MessageType::FATAL_ERROR,
      "Languages may not be enabled during deferred execution.");
    return;
  }
  if (const char* def = this->GetGlobalGenerator()->GetCMakeCFGIntDir()) {
    this->AddDefinition("CMAKE_CFG_INTDIR", def);
  }

  std::vector<std::string> unique_languages;
  {
    std::vector<std::string> duplicate_languages;
    for (std::string const& language : languages) {
      if (!cm::contains(unique_languages, language)) {
        unique_languages.push_back(language);
      } else if (!cm::contains(duplicate_languages, language)) {
        duplicate_languages.push_back(language);
      }
    }
    if (!duplicate_languages.empty()) {
      auto quantity = duplicate_languages.size() == 1 ? std::string(" has")
                                                      : std::string("s have");
      this->IssueMessage(MessageType::AUTHOR_WARNING,
                         "Languages to be enabled may not be specified more "
                         "than once at the same time. The following language" +
                           quantity + " been specified multiple times: " +
                           cmJoin(duplicate_languages, ", "));
    }
  }

  // If RC is explicitly listed we need to do it after other languages.
  // On some platforms we enable RC implicitly while enabling others.
  // Do not let that look like recursive enable_language(RC).
  std::vector<std::string> languages_without_RC;
  std::vector<std::string> languages_for_RC;
  languages_without_RC.reserve(unique_languages.size());
  for (std::string const& language : unique_languages) {
    if (language == "RC") {
      languages_for_RC.push_back(language);
    } else {
      languages_without_RC.push_back(language);
    }
  }
  if (!languages_without_RC.empty()) {
    this->GetGlobalGenerator()->EnableLanguage(languages_without_RC, this,
                                               optional);
  }
  if (!languages_for_RC.empty()) {
    this->GetGlobalGenerator()->EnableLanguage(languages_for_RC, this,
                                               optional);
  }
}